

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFDocumentHandler.cpp
# Opt level: O0

EStatusCode __thiscall
PDFDocumentHandler::CopyDirectObjectToIndirectObject
          (PDFDocumentHandler *this,PDFObject *inObject,ObjectIDType inTargetObjectID)

{
  EPDFObjectType EVar1;
  undefined1 local_60 [8];
  OutWritingPolicy writingPolicy;
  ObjectIDTypeList newObjectsToWrite;
  EStatusCode status;
  ObjectIDType inTargetObjectID_local;
  PDFObject *inObject_local;
  PDFDocumentHandler *this_local;
  
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::list
            ((list<unsigned_long,_std::allocator<unsigned_long>_> *)
             &writingPolicy.mSourceObjectsToAdd);
  OutWritingPolicy::OutWritingPolicy
            ((OutWritingPolicy *)local_60,this,
             (ObjectIDTypeList *)&writingPolicy.mSourceObjectsToAdd);
  this_local._4_4_ = ObjectsContext::StartNewIndirectObject(this->mObjectsContext,inTargetObjectID);
  if ((this_local._4_4_ == eSuccess) &&
     (this_local._4_4_ =
           WriteObjectByType(this,inObject,eTokenSeparatorEndLine,(IObjectWritePolicy *)local_60),
     this_local._4_4_ == eSuccess)) {
    EVar1 = PDFObject::GetType(inObject);
    if (EVar1 != ePDFObjectStream) {
      ObjectsContext::EndIndirectObject(this->mObjectsContext);
    }
    this_local._4_4_ = WriteNewObjects(this,(ObjectIDTypeList *)&writingPolicy.mSourceObjectsToAdd);
  }
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::~list
            ((list<unsigned_long,_std::allocator<unsigned_long>_> *)
             &writingPolicy.mSourceObjectsToAdd);
  return this_local._4_4_;
}

Assistant:

EStatusCode PDFDocumentHandler::CopyDirectObjectToIndirectObject(PDFObject* inObject,ObjectIDType inTargetObjectID)
{
	EStatusCode status;
	ObjectIDTypeList newObjectsToWrite;
	OutWritingPolicy writingPolicy(this, newObjectsToWrite);

	status = mObjectsContext->StartNewIndirectObject(inTargetObjectID);
	if(status != PDFHummus::eSuccess)
		return status;
	status = WriteObjectByType(inObject,eTokenSeparatorEndLine, &writingPolicy);
	if(PDFHummus::eSuccess == status)
	{
		if(inObject->GetType() != PDFObject::ePDFObjectStream) // write indirect object end for non streams only...cause they take care of writing their own
			mObjectsContext->EndIndirectObject();
		return WriteNewObjects(newObjectsToWrite);
	}
	else
		return status;
}